

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_structs.hpp
# Opt level: O2

bool plot::detail::unicode_cp_in_tree<void>(char32_t cp,unicode_interval_tree_t *tree)

{
  for (; (tree != (unicode_interval_tree_t *)0x0 &&
         (((uint)cp < (uint)(tree->interval).first || ((uint)(tree->interval).second < (uint)cp))));
      tree = (&tree->left)[(uint)tree->center <= (uint)cp]) {
  }
  return tree != (unicode_interval_tree_t *)0x0;
}

Assistant:

bool unicode_cp_in_tree(char32_t cp, unicode_interval_tree_t const* tree) {
        while (tree) {
            if (cp >= tree->interval.first && cp <= tree->interval.second)
                return true;

            tree = (cp < tree->center) ? tree->left : tree->right;
        }

        return false;
    }